

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_private.hpp
# Opt level: O0

bool __thiscall
Infector::Container::tryToGetSize<BadClassVS,GoodClassVS,Infector::DummyClass>
          (Container *this,RecursionLimit *limit,int *size)

{
  bool bVar1;
  bool bVar2;
  pointer ppVar3;
  pointer ppVar4;
  bool local_79;
  bool result;
  bool recursiveExpansion;
  _Node_iterator_base<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false>
  _Stack_50;
  bool horizontalExpansion;
  _Node_iterator_base<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false>
  local_48;
  iterator it2;
  type_index local_38;
  _Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
  local_30;
  iterator it;
  int *size_local;
  RecursionLimit *limit_local;
  Container *this_local;
  
  it.
  super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
            )(_Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
              )size;
  std::type_index::type_index(&local_38,(type_info *)&BadClassVS::typeinfo);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_Infector::Container::Binding,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>_>
       ::find(&this->typeMap,&local_38);
  it2.
  super__Node_iterator_base<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false>
             )std::
              unordered_map<std::type_index,_Infector::Container::Binding,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>_>
              ::end(&this->typeMap);
  bVar1 = std::__detail::operator==
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                      *)&it2);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
                           *)&local_30);
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>_>_>
         ::find(&this->recursionMap,&(ppVar3->second).type);
    _Stack_50._M_cur =
         (__node_type *)
         std::
         unordered_map<std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>_>_>
         ::end(&this->recursionMap);
    bVar1 = std::__detail::operator==(&local_48,&stack0xffffffffffffffb0);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = tryToGetSize<GoodClassVS,Infector::DummyClass>
                        (this,limit,
                         (int *)it.
                                super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                                ._M_cur);
      *(int *)it.
              super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
              ._M_cur =
           *(int *)it.
                   super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                   ._M_cur + 1;
      RecursionLimit::increment(limit);
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>,_false,_false>
                             *)&local_48);
      bVar2 = std::function<bool_(Infector::RecursionLimit_*,_int_*)>::operator()
                        (&ppVar4->second,limit,
                         (int *)it.
                                super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                                ._M_cur);
      RecursionLimit::decrement(limit);
      local_79 = false;
      if (bVar1) {
        local_79 = bVar2;
      }
      this_local._7_1_ = local_79;
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
                             *)&local_30);
      setKnownSizeForType<Infector::DummyClass>
                (this,(ppVar3->second).type._M_target,local_79,
                 *(int *)it.
                         super__Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                         ._M_cur);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Container::tryToGetSize( RecursionLimit *limit, int *size){
        //get abstract type
        auto it = typeMap.find( std::type_index(typeid(Actual)) );
        if( it==typeMap.end())
            return false; //abstract type not registered

        auto it2 = recursionMap.find(  it->second.type ); //get concrete funct
        if( it2==recursionMap.end())
            return false; // concrete functor not created yet..

        bool horizontalExpansion = tryToGetSize<Next,Others...>(limit,size);

        (*size)+= sizeof(Actual);
        (*limit).increment();
        bool recursiveExpansion = (it2->second)(limit,size);
        (*limit).decrement();

        bool result = true&&horizontalExpansion&&recursiveExpansion;
        setKnownSizeForType(it->second.type, result, (*size));
        return result;
    }